

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automatic_injection.cpp
# Opt level: O1

int main(void)

{
  i injector;
  stack local_29;
  provider<boost::ext::di::v1_3_0::aux::pair<example1,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  local_28;
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  local_20;
  
  local_28.injector_ = &local_20;
  local_20.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  .
  super_dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  .super_scope<int,_int,_int>.object_ = (scope<int,_int,_int>)0x2a;
  local_20.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  .
  super_dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  .super_scope<double,_double,_int>.object_ = (scope<double,_double,_int>)87.0;
  boost::ext::di::v1_3_0::core::successful::
  provider<boost::ext::di::v1_3_0::aux::pair<example1,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>,_boost::ext::di::v1_3_0::core::any_type_fwd<example1>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  ::get<boost::ext::di::v1_3_0::type_traits::stack>(&local_28,&local_29);
  if (local_20.
      super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
      .
      super_dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
      .super_scope<int,_int,_int>.object_ == 0x2a) {
    return 0;
  }
  __assert_fail("i == 42",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/automatic_injection.cpp"
                ,0x1c,"example2::example2(int, ...)");
}

Assistant:

int main() {
  /*<<make injector and bind named parameters>>*/
  // clang-format off
  auto injector = di::make_injector(
    di::bind<int>().to(42)
  , di::bind<double>().to(87.0)
  );
  // clang-format on

  /*<<create `example1`>>*/
  injector.create<example1>();

  /*<<create `example2`>>*/
  injector.create<example2>();
}